

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_ptr.h
# Opt level: O2

copy_ptr<cppcms::xss::rules::data> * __thiscall
booster::copy_ptr<cppcms::xss::rules::data>::operator=
          (copy_ptr<cppcms::xss::rules::data> *this,copy_ptr<cppcms::xss::rules::data> *other)

{
  data *pdVar1;
  data *in_RAX;
  copy_ptr<cppcms::xss::rules::data> tmp;
  copy_ptr<cppcms::xss::rules::data> local_18;
  
  if (this != other) {
    local_18.ptr_ = in_RAX;
    copy_ptr(&local_18,other);
    pdVar1 = this->ptr_;
    this->ptr_ = (data *)local_18;
    local_18.ptr_ = pdVar1;
    ~copy_ptr(&local_18);
  }
  return this;
}

Assistant:

copy_ptr const &operator=(copy_ptr const &other)
		{
			if(this != &other) {
				copy_ptr tmp(other);
				swap(tmp);
			}
			return *this;
		}